

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
* __thiscall
Lib::
iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
          (IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
           *__return_storage_ptr__,Lib *this,
          Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *p)

{
  tuple<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  tVar1;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_48;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_38;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_28;
  
  tVar1.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         *)this;
  *(undefined8 *)this = 0;
  local_48._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
          )0x0;
  local_38._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
          )0x0;
  (__return_storage_ptr__->_iter)._p._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
       = tVar1.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
         ._M_head_impl;
  local_28._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
          )0x0;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_28);
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_38);
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto iterPointer(P p) { return iterTraits(IterPointer<P>(std::move(p))); }